

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_post.c
# Opt level: O3

int post_form(FORM *form)

{
  short sVar1;
  undefined2 uVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  int iVar7;
  WINDOW_conflict *pWVar8;
  
  if (form == (FORM *)0x0) {
    iVar5 = -2;
    goto LAB_003a1960;
  }
  iVar5 = -3;
  if ((form->status & 1) != 0) goto LAB_003a1960;
  if (form->field == (FIELD **)0x0) {
    iVar5 = -0xb;
    goto LAB_003a1960;
  }
  pWVar8 = form->sub;
  if (pWVar8 == (WINDOW_conflict *)0x0) {
    pWVar8 = form->win;
    if (form->win == (WINDOW_conflict *)0x0) {
      pWVar8 = _stdscr;
    }
    if (pWVar8 != (WINDOW_conflict *)0x0) goto LAB_003a18cd;
    iVar4 = -1;
    iVar7 = -1;
  }
  else {
LAB_003a18cd:
    iVar4 = pWVar8->_maxy + 1;
    iVar7 = pWVar8->_maxx + 1;
  }
  iVar5 = -6;
  if ((form->cols <= iVar7) && (form->rows <= iVar4)) {
    sVar1 = form->curpage;
    form->curpage = -1;
    iVar5 = _nc_Set_Form_Page(form,(int)sVar1,form->current);
    if (iVar5 == 0) {
      uVar2 = form->status;
      uVar3 = uVar2 | 1;
      form->status = uVar3;
      if (form->forminit != (_func_void_formnode_ptr *)0x0) {
        form->status = uVar2 | 3;
        (*form->forminit)(form);
        uVar3 = form->status & 0xfffd;
        form->status = uVar3;
      }
      if (form->fieldinit != (_func_void_formnode_ptr *)0x0) {
        form->status = uVar3 | 2;
        (*form->fieldinit)(form);
        *(byte *)&form->status = (byte)form->status & 0xfd;
      }
      _nc_Refresh_Current_Field(form);
      iVar5 = 0;
    }
  }
LAB_003a1960:
  piVar6 = __errno_location();
  *piVar6 = iVar5;
  return iVar5;
}

Assistant:

int post_form(FORM * form)
{
  WINDOW *formwin;
  int err;
  int page;
  int height, width;

  if (!form)
    RETURN(E_BAD_ARGUMENT);

  if (form->status & _POSTED)   
    RETURN(E_POSTED);

  if (!(form->field))
    RETURN(E_NOT_CONNECTED);
  
  formwin = Get_Form_Window(form);
  getmaxyx(formwin, height, width);
  if ((form->cols > width) || (form->rows > height))
    RETURN(E_NO_ROOM);

  /* reset form->curpage to an invalid value. This forces Set_Form_Page
     to do the page initialization which is required by post_form.
  */
  page = form->curpage;
  form->curpage = -1;
  if ((err = _nc_Set_Form_Page(form,page,form->current))!=E_OK)
    RETURN(err);

  form->status |= _POSTED;

  Call_Hook(form,forminit);
  Call_Hook(form,fieldinit);

  _nc_Refresh_Current_Field(form);
  RETURN(E_OK);
}